

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void kj::ArrayDisposer::Dispose_<kj::_::Delimited<kj::ArrayPtr<int>_>_>::destruct(void *ptr)

{
  void *ptr_local;
  
  dtor<kj::_::Delimited<kj::ArrayPtr<int>>>((Delimited<kj::ArrayPtr<int>_> *)ptr);
  return;
}

Assistant:

static void destruct(void* ptr) {
    kj::dtor(*reinterpret_cast<T*>(ptr));
  }